

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O3

Byte * __thiscall
CharStringType2Interpreter::InterpretDiv
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  _List_node_base *p_Var5;
  int iVar6;
  Trace *this_00;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  undefined1 uVar9;
  
  iVar6 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x21])
                    (this->mImplementationHelper,this);
  if (iVar6 == 0) {
    uVar4 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
    if (uVar4 < 2) {
      this_00 = Trace::DefaultTrace();
      inProgramCounter = (Byte *)0x0;
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretDiv, div should have at least 2 arguments on stack. got %d. aborting"
                        ,(this->mOperandStack).
                         super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                         _M_impl._M_node._M_size);
    }
    else {
      p_Var8 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      bVar2 = *(byte *)&p_Var8[1]._M_next;
      p_Var5 = p_Var8[1]._M_prev;
      (this->mOperandStack).super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
      _M_impl._M_node._M_size = uVar4 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var8,0x20);
      p_Var8 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      bVar3 = *(byte *)&p_Var8[1]._M_next;
      p_Var7 = p_Var8[1]._M_prev;
      psVar1 = &(this->mOperandStack).
                super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var8,0x20);
      if ((bVar3 & bVar2 & 1) == 0) {
        p_Var8 = p_Var5;
        if ((bVar2 & 1) != 0) {
          p_Var8 = (_List_node_base *)(double)(long)p_Var5;
        }
        if ((bVar3 & 1) != 0) {
          p_Var7 = (_List_node_base *)(double)(long)p_Var7;
          p_Var8 = p_Var5;
        }
        p_Var7 = (_List_node_base *)((double)p_Var7 / (double)p_Var8);
        uVar9 = 0;
      }
      else {
        p_Var7 = (_List_node_base *)((long)p_Var7 / (long)p_Var5);
        uVar9 = 1;
      }
      p_Var8 = (_List_node_base *)operator_new(0x20);
      *(undefined1 *)&p_Var8[1]._M_next = uVar9;
      p_Var8[1]._M_prev = p_Var7;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      psVar1 = &(this->mOperandStack).
                super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  else {
    inProgramCounter = (Byte *)0x0;
  }
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretDiv(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Div(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand newOperand;


	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretDiv, div should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}


	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	if(!valueA.IsInteger || !valueB.IsInteger)
	{
		newOperand.IsInteger = false;
		newOperand.RealValue = 
			(valueA.IsInteger ? (double)valueA.IntegerValue : valueA.RealValue)
			/
			(valueB.IsInteger ? (double)valueB.IntegerValue : valueB.RealValue);
	}
	else
	{
		newOperand.IsInteger = true;
		newOperand.IntegerValue = valueA.IntegerValue / valueB.IntegerValue;
	}
	mOperandStack.push_back(newOperand);
	return inProgramCounter;
}